

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mixed_arena.h
# Opt level: O2

Unary * __thiscall MixedArena::alloc<wasm::Unary>(MixedArena *this)

{
  Unary *pUVar1;
  
  pUVar1 = (Unary *)allocSpace(this,0x20,8);
  (pUVar1->super_SpecificExpression<(wasm::Expression::Id)15>).super_Expression._id = UnaryId;
  (pUVar1->super_SpecificExpression<(wasm::Expression::Id)15>).super_Expression.type.id = 0;
  return pUVar1;
}

Assistant:

T* alloc() {
    static_assert(alignof(T) <= MAX_ALIGN,
                  "maximum alignment not large enough");
    auto* ret = static_cast<T*>(allocSpace(sizeof(T), alignof(T)));
    new (ret) T(*this); // allocated objects receive the allocator, so they can
                        // allocate more later if necessary
    return ret;
  }